

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

void __thiscall spvtools::opt::SSAPropagator::AddSSAEdges(SSAPropagator *this,Instruction *instr)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  anon_class_8_1_8991fb9c local_40;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  Instruction *local_18;
  Instruction *instr_local;
  SSAPropagator *this_local;
  
  local_18 = instr;
  instr_local = (Instruction *)this;
  uVar1 = opt::Instruction::result_id(instr);
  if (uVar1 != 0) {
    this_00 = get_def_use_mgr(this);
    uVar1 = opt::Instruction::result_id(local_18);
    local_40.this = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::SSAPropagator::AddSSAEdges(spvtools::opt::Instruction*)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_38,&local_40);
    analysis::DefUseManager::ForEachUser(this_00,uVar1,&local_38);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
  }
  return;
}

Assistant:

void SSAPropagator::AddSSAEdges(Instruction* instr) {
  // Ignore instructions that produce no result.
  if (instr->result_id() == 0) {
    return;
  }

  get_def_use_mgr()->ForEachUser(
      instr->result_id(), [this](Instruction* use_instr) {
        // If the basic block for |use_instr| has not been simulated yet, do
        // nothing.  The instruction |use_instr| will be simulated next time the
        // block is scheduled.
        if (!BlockHasBeenSimulated(ctx_->get_instr_block(use_instr))) {
          return;
        }

        if (ShouldSimulateAgain(use_instr)) {
          ssa_edge_uses_.push(use_instr);
        }
      });
}